

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_dec(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  unsigned___int128 *puVar1;
  buffer<char> *pbVar2;
  basic_format_specs<char> *specs;
  size_t sVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  char *__dest;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint num_digits;
  undefined1 *puVar10;
  buffer<char> *c;
  ulong uVar11;
  char *__dest_00;
  ptrdiff_t _Num;
  ulong uVar12;
  string_view prefix;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  write_int_data<char> data;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
  *message;
  char *file;
  write_int_data<char> local_98;
  undefined1 local_88 [88];
  
  auVar13 = (undefined1  [16])this->abs_value;
  num_digits = 1;
  if ((ulong)((ulong)this->abs_value < 10) <= *(ulong *)((long)&this->abs_value + 8)) {
    uVar4 = 4;
    do {
      num_digits = uVar4;
      uVar7 = auVar13._8_8_;
      uVar6 = auVar13._0_8_;
      if (uVar7 == 0 && (ulong)(99 < uVar6) <= -uVar7) {
        num_digits = num_digits - 2;
        goto LAB_0010a505;
      }
      if (uVar7 == 0 && (ulong)(999 < uVar6) <= -uVar7) {
        num_digits = num_digits - 1;
        goto LAB_0010a505;
      }
      if (uVar7 < (uVar6 < 10000)) goto LAB_0010a505;
      auVar13 = __udivti3(uVar6,uVar7,10000,0);
      uVar4 = num_digits + 4;
    } while (uVar7 != 0 || -uVar7 < (ulong)(99999 < uVar6));
    num_digits = num_digits + 1;
  }
LAB_0010a505:
  pbVar2 = (this->out).container;
  specs = this->specs;
  file = this->prefix;
  uVar7 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = file;
  prefix.size_._4_4_ = 0;
  message = this;
  write_int_data<char>::write_int_data(&local_98,num_digits,prefix,specs);
  uVar6 = (ulong)specs->width;
  if ((long)uVar6 < 0) {
    assert_fail(file,0,(char *)message);
  }
  uVar9 = 0;
  if (local_98.size <= uVar6) {
    uVar9 = uVar6 - local_98.size;
  }
  uVar6 = uVar9 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                             (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  sVar3 = pbVar2->size_;
  uVar11 = local_98.size + sVar3 + (specs->fill).size_ * uVar9;
  if (pbVar2->capacity_ < uVar11) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar11);
  }
  pbVar2->size_ = uVar11;
  __dest = fill<char*,char>(pbVar2->ptr_ + sVar3,uVar6,&specs->fill);
  if (uVar7 != 0) {
    memmove(__dest,file,uVar7);
    __dest = __dest + uVar7;
  }
  __dest_00 = __dest;
  if (local_98.padding != 0) {
    __dest_00 = __dest + local_98.padding;
    memset(__dest,0x30,local_98.padding);
  }
  if ((int)num_digits < 0) {
    assert_fail(file,0,(char *)message);
  }
  puVar1 = &this->abs_value;
  auVar14 = (undefined1  [16])*puVar1;
  auVar13 = (undefined1  [16])*puVar1;
  uVar7 = (ulong)num_digits;
  puVar10 = local_88 + uVar7;
  if ((ulong)((ulong)*puVar1 < 100) <= *(ulong *)((long)&this->abs_value + 8)) {
    do {
      lVar8 = auVar13._8_8_;
      uVar12 = auVar13._0_8_;
      auVar14 = __udivti3(uVar12,lVar8,100,0);
      uVar11 = (ulong)(uint)(auVar13._0_4_ + auVar14._0_4_ * -100);
      puVar10[-1] = basic_data<void>::digits[(uVar11 * 2 & 0xffffffff) + 1];
      puVar10[-2] = basic_data<void>::digits[uVar11 * 2];
      puVar10 = puVar10 + -2;
      auVar13 = auVar14;
    } while (lVar8 != 0 || (ulong)-lVar8 < (ulong)(9999 < uVar12));
  }
  if (auVar14._8_8_ == 0 && (ulong)(9 < auVar14._0_8_) <= (ulong)-auVar14._8_8_) {
    bVar5 = auVar14[0] | 0x30;
    lVar8 = -1;
  }
  else {
    uVar11 = auVar14._0_8_ * 2;
    puVar10[-1] = basic_data<void>::digits[(uVar11 & 0xffffffff) + 1];
    bVar5 = basic_data<void>::digits[uVar11 & 0x1fffffffe];
    lVar8 = -2;
  }
  puVar10[lVar8] = bVar5;
  memmove(__dest_00,local_88,uVar7);
  fill<char*,char>(__dest_00 + uVar7,uVar9 - uVar6,&specs->fill);
  (message->out).container = pbVar2;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_decimal<Char>(it, abs_value, num_digits);
                    });
  }